

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O1

void Bac_Init(Abc_Frame_t *pAbc)

{
  Cmd_CommandAdd(pAbc,"New word level","@_read",Bac_CommandRead,0);
  Cmd_CommandAdd(pAbc,"New word level","@_write",Bac_CommandWrite,0);
  Cmd_CommandAdd(pAbc,"New word level","@_ps",Bac_CommandPs,0);
  Cmd_CommandAdd(pAbc,"New word level","@_put",Bac_CommandPut,0);
  Cmd_CommandAdd(pAbc,"New word level","@_get",Bac_CommandGet,0);
  Cmd_CommandAdd(pAbc,"New word level","@_clp",Bac_CommandClp,0);
  Cmd_CommandAdd(pAbc,"New word level","@_cec",Bac_CommandCec,0);
  Cmd_CommandAdd(pAbc,"New word level","@_test",Bac_CommandTest,0);
  return;
}

Assistant:

void Bac_Init( Abc_Frame_t * pAbc )
{
    Cmd_CommandAdd( pAbc, "New word level", "@_read",       Bac_CommandRead,      0 );
    Cmd_CommandAdd( pAbc, "New word level", "@_write",      Bac_CommandWrite,     0 );
    Cmd_CommandAdd( pAbc, "New word level", "@_ps",         Bac_CommandPs,        0 );
    Cmd_CommandAdd( pAbc, "New word level", "@_put",        Bac_CommandPut,       0 );
    Cmd_CommandAdd( pAbc, "New word level", "@_get",        Bac_CommandGet,       0 );
    Cmd_CommandAdd( pAbc, "New word level", "@_clp",        Bac_CommandClp,       0 );
    Cmd_CommandAdd( pAbc, "New word level", "@_cec",        Bac_CommandCec,       0 );
    Cmd_CommandAdd( pAbc, "New word level", "@_test",       Bac_CommandTest,      0 );
}